

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O0

void __thiscall bdQueryHistory::cleanupOldMsgs(bdQueryHistory *this)

{
  bool bVar1;
  time_t tVar2;
  pointer ppVar3;
  _Rb_tree_iterator<std::pair<const_bdId,_bdQueryHistoryList>_> local_38;
  iterator tit;
  _Rb_tree_iterator<std::pair<const_bdId,_bdQueryHistoryList>_> local_20;
  iterator it;
  time_t before;
  bdQueryHistory *this_local;
  
  if (this->mStorePeriod != 0) {
    tVar2 = time((time_t *)0x0);
    it._M_node = (_Base_ptr)(tVar2 - this->mStorePeriod);
    std::_Rb_tree_iterator<std::pair<const_bdId,_bdQueryHistoryList>_>::_Rb_tree_iterator(&local_20)
    ;
    local_20._M_node =
         (_Base_ptr)
         std::
         map<bdId,_bdQueryHistoryList,_std::less<bdId>,_std::allocator<std::pair<const_bdId,_bdQueryHistoryList>_>_>
         ::begin(&this->mHistory);
    while( true ) {
      tit = std::
            map<bdId,_bdQueryHistoryList,_std::less<bdId>,_std::allocator<std::pair<const_bdId,_bdQueryHistoryList>_>_>
            ::end(&this->mHistory);
      bVar1 = std::operator!=(&local_20,&tit);
      if (!bVar1) break;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_bdId,_bdQueryHistoryList>_>::operator->
                         (&local_20);
      bVar1 = bdQueryHistoryList::cleanupMsgs(&ppVar3->second,(time_t)it._M_node);
      if (bVar1) {
        local_38._M_node = local_20._M_node;
        std::_Rb_tree_iterator<std::pair<const_bdId,_bdQueryHistoryList>_>::operator++(&local_38);
        std::
        map<bdId,bdQueryHistoryList,std::less<bdId>,std::allocator<std::pair<bdId_const,bdQueryHistoryList>>>
        ::erase_abi_cxx11_((map<bdId,bdQueryHistoryList,std::less<bdId>,std::allocator<std::pair<bdId_const,bdQueryHistoryList>>>
                            *)&this->mHistory,(iterator)local_20._M_node);
        local_20._M_node = local_38._M_node;
      }
      else {
        std::_Rb_tree_iterator<std::pair<const_bdId,_bdQueryHistoryList>_>::operator++(&local_20);
      }
    }
  }
  return;
}

Assistant:

void bdQueryHistory::cleanupOldMsgs() {
	if (mStorePeriod == 0)
		return; // no cleanup.

	time_t before = time(NULL) - mStorePeriod;
	std::map<bdId, bdQueryHistoryList>::iterator it;
	for (it = mHistory.begin(); it != mHistory.end(); ) {
		if (it->second.cleanupMsgs(before)) {
			std::map<bdId, bdQueryHistoryList>::iterator tit(it);
			++tit;
			mHistory.erase(it);
			it = tit;
		} else
            ++it;
	}
}